

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# blockchain.cpp
# Opt level: O0

RPCHelpMan * getblockheader(void)

{
  initializer_list<RPCArg> __l;
  initializer_list<RPCResult> __l_00;
  initializer_list<RPCResult> results;
  RPCHelpMan *in_RDI;
  long in_FS_OFFSET;
  allocator<RPCArg> *in_stack_ffffffffffffe688;
  vector<RPCResult,_std::allocator<RPCResult>_> *this;
  allocator<RPCResult> *this_00;
  RPCArg *this_01;
  UniValue *in_stack_ffffffffffffe690;
  function<UniValue_(const_RPCHelpMan_&,_const_JSONRPCRequest_&)> *in_stack_ffffffffffffe698;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffe6a0;
  RPCResults *in_stack_ffffffffffffe6b0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffe6b8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffe6c0;
  UniValue *in_stack_ffffffffffffe6c8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffe6d0;
  undefined7 in_stack_ffffffffffffe6d8;
  undefined1 in_stack_ffffffffffffe6df;
  string *in_stack_ffffffffffffe6e0;
  undefined7 in_stack_ffffffffffffe6e8;
  undefined1 in_stack_ffffffffffffe6ef;
  undefined4 in_stack_ffffffffffffe6f0;
  Type in_stack_ffffffffffffe6f4;
  string *in_stack_ffffffffffffe6f8;
  undefined4 in_stack_ffffffffffffe700;
  Type in_stack_ffffffffffffe704;
  undefined4 in_stack_ffffffffffffe708;
  Type in_stack_ffffffffffffe70c;
  RPCResult *in_stack_ffffffffffffe710;
  undefined1 *local_18d8;
  undefined1 *local_18c0;
  undefined1 *local_18a8;
  RPCExamples *examples;
  RPCResults *results_00;
  vector<RPCArg,_std::allocator<RPCArg>_> *args;
  string *description;
  string *name;
  RPCHelpMan *this_02;
  RPCMethodImpl *fun;
  undefined1 local_15a0 [37];
  allocator<char> local_157b;
  allocator<char> local_157a;
  allocator<char> local_1579;
  pointer local_1578;
  pointer pRStack_1570;
  pointer local_1568;
  allocator<char> local_155c;
  allocator<char> local_155b;
  allocator<char> local_155a [32];
  allocator<char> local_153a;
  undefined1 local_1539 [31];
  undefined1 local_151a;
  undefined1 local_1519 [31];
  allocator<char> local_14fa;
  allocator<char> local_14f9;
  size_type local_14f8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  aStack_14f0;
  allocator<char> local_14da;
  allocator<char> local_14d9;
  _Alloc_hider local_14d8;
  size_type sStack_14d0;
  undefined1 local_14c8 [15];
  allocator<char> local_14b9;
  pointer local_14b8;
  pointer pbStack_14b0;
  pointer local_14a8;
  allocator<char> local_149a;
  allocator<char> local_1499;
  undefined8 local_1498;
  undefined8 uStack_1490;
  undefined8 local_1488;
  allocator<char> local_147a;
  allocator<char> local_1479;
  undefined8 local_1478;
  undefined8 uStack_1470;
  undefined8 local_1468;
  allocator<char> local_1459;
  undefined8 local_1458;
  undefined8 uStack_1450;
  undefined8 local_1448;
  allocator<char> local_1439;
  undefined8 local_1438;
  undefined8 uStack_1430;
  undefined8 local_1428;
  allocator<char> local_141a;
  allocator<char> local_1419;
  undefined8 local_1418;
  undefined8 uStack_1410;
  undefined8 local_1408;
  undefined1 local_13fa [10];
  undefined8 uStack_13f0;
  undefined8 local_13e8;
  allocator<char> local_13da;
  allocator<char> local_13d9;
  undefined8 local_13d8;
  undefined8 uStack_13d0;
  undefined8 local_13c8;
  allocator<char> local_13ba;
  allocator<char> local_13b9;
  undefined8 local_13b8;
  undefined8 uStack_13b0;
  undefined8 local_13a8;
  allocator<char> local_139a;
  allocator<char> local_1399;
  undefined8 local_1398;
  undefined8 uStack_1390;
  undefined8 local_1388;
  allocator<char> local_1372;
  allocator<char> local_1371 [30];
  allocator<char> local_1353;
  allocator<char> local_1352;
  allocator<char> local_1351 [29];
  allocator<char> local_1334;
  undefined1 local_1333;
  allocator<char> local_1332;
  allocator<char> local_1331;
  undefined4 local_1330;
  allocator<char> local_1329 [31];
  allocator<char> local_130a;
  allocator<char> local_1309 [777];
  undefined8 local_1000;
  undefined1 local_de8 [1768];
  string local_700 [8];
  undefined1 local_5f0 [96];
  undefined1 local_590 [272];
  undefined1 local_480 [40];
  undefined8 local_458;
  undefined8 uStack_450;
  undefined8 local_448;
  undefined1 local_440;
  undefined1 local_43f;
  undefined1 local_340;
  undefined8 local_318;
  undefined8 uStack_310;
  undefined8 local_308;
  undefined1 local_300;
  undefined1 local_2ff;
  undefined1 local_258 [528];
  undefined1 local_48 [64];
  long local_8;
  
  local_1000 = 0;
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_ffffffffffffe6df,in_stack_ffffffffffffe6d8),
             (char *)in_stack_ffffffffffffe6d0,(allocator<char> *)in_stack_ffffffffffffe6c8);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_ffffffffffffe6df,in_stack_ffffffffffffe6d8),
             (char *)in_stack_ffffffffffffe6d0,(allocator<char> *)in_stack_ffffffffffffe6c8);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_ffffffffffffe6df,in_stack_ffffffffffffe6d8),
             (char *)in_stack_ffffffffffffe6d0,(allocator<char> *)in_stack_ffffffffffffe6c8);
  local_1330 = 0;
  std::variant<RPCArg::Optional,std::__cxx11::string,UniValue>::
  variant<RPCArg::Optional,void,void,RPCArg::Optional,void>
            ((variant<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
              *)in_stack_ffffffffffffe698,&in_stack_ffffffffffffe690->typ);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_ffffffffffffe6df,in_stack_ffffffffffffe6d8),
             (char *)in_stack_ffffffffffffe6d0,(allocator<char> *)in_stack_ffffffffffffe6c8);
  local_340 = 0;
  std::__cxx11::string::string(in_stack_ffffffffffffe6a0);
  local_318 = 0;
  uStack_310 = 0;
  local_308 = 0;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)in_stack_ffffffffffffe688);
  local_300 = 0;
  local_2ff = 0;
  RPCArg::RPCArg((RPCArg *)CONCAT44(in_stack_ffffffffffffe704,in_stack_ffffffffffffe700),
                 in_stack_ffffffffffffe6f8,in_stack_ffffffffffffe6f4,
                 (Fallback *)CONCAT17(in_stack_ffffffffffffe6ef,in_stack_ffffffffffffe6e8),
                 in_stack_ffffffffffffe6e0,
                 (RPCArgOptions *)CONCAT17(in_stack_ffffffffffffe6df,in_stack_ffffffffffffe6d8));
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_ffffffffffffe6df,in_stack_ffffffffffffe6d8),
             (char *)in_stack_ffffffffffffe6d0,(allocator<char> *)in_stack_ffffffffffffe6c8);
  local_1333 = 1;
  UniValue::UniValue<bool,_bool,_true>(in_stack_ffffffffffffe6c8,(bool *)in_stack_ffffffffffffe6c0);
  std::variant<RPCArg::Optional,std::__cxx11::string,UniValue>::
  variant<UniValue,void,void,UniValue,void>
            ((variant<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
              *)in_stack_ffffffffffffe698,in_stack_ffffffffffffe690);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_ffffffffffffe6df,in_stack_ffffffffffffe6d8),
             (char *)in_stack_ffffffffffffe6d0,(allocator<char> *)in_stack_ffffffffffffe6c8);
  local_480[0] = 0;
  std::__cxx11::string::string(in_stack_ffffffffffffe6a0);
  local_458 = 0;
  uStack_450 = 0;
  local_448 = 0;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)in_stack_ffffffffffffe688);
  local_440 = 0;
  local_43f = 0;
  RPCArg::RPCArg((RPCArg *)CONCAT44(in_stack_ffffffffffffe704,in_stack_ffffffffffffe700),
                 in_stack_ffffffffffffe6f8,in_stack_ffffffffffffe6f4,
                 (Fallback *)CONCAT17(in_stack_ffffffffffffe6ef,in_stack_ffffffffffffe6e8),
                 in_stack_ffffffffffffe6e0,
                 (RPCArgOptions *)CONCAT17(in_stack_ffffffffffffe6df,in_stack_ffffffffffffe6d8));
  std::allocator<RPCArg>::allocator(in_stack_ffffffffffffe688);
  __l._M_len._0_7_ = in_stack_ffffffffffffe6d8;
  __l._M_array = (iterator)in_stack_ffffffffffffe6d0;
  __l._M_len._7_1_ = in_stack_ffffffffffffe6df;
  std::vector<RPCArg,_std::allocator<RPCArg>_>::vector
            ((vector<RPCArg,_std::allocator<RPCArg>_> *)in_stack_ffffffffffffe6c8,__l,
             (allocator_type *)in_stack_ffffffffffffe6c0);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_ffffffffffffe6df,in_stack_ffffffffffffe6d8),
             (char *)in_stack_ffffffffffffe6d0,(allocator<char> *)in_stack_ffffffffffffe6c8);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_ffffffffffffe6df,in_stack_ffffffffffffe6d8),
             (char *)in_stack_ffffffffffffe6d0,(allocator<char> *)in_stack_ffffffffffffe6c8);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_ffffffffffffe6df,in_stack_ffffffffffffe6d8),
             (char *)in_stack_ffffffffffffe6d0,(allocator<char> *)in_stack_ffffffffffffe6c8);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_ffffffffffffe6df,in_stack_ffffffffffffe6d8),
             (char *)in_stack_ffffffffffffe6d0,(allocator<char> *)in_stack_ffffffffffffe6c8);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_ffffffffffffe6df,in_stack_ffffffffffffe6d8),
             (char *)in_stack_ffffffffffffe6d0,(allocator<char> *)in_stack_ffffffffffffe6c8);
  local_1398 = 0;
  uStack_1390 = 0;
  local_1388 = 0;
  std::vector<RPCResult,_std::allocator<RPCResult>_>::vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)in_stack_ffffffffffffe688);
  RPCResult::RPCResult
            (in_stack_ffffffffffffe710,in_stack_ffffffffffffe70c,
             (string *)CONCAT44(in_stack_ffffffffffffe704,in_stack_ffffffffffffe700),
             in_stack_ffffffffffffe6f8,
             (vector<RPCResult,_std::allocator<RPCResult>_> *)
             CONCAT44(in_stack_ffffffffffffe6f4,in_stack_ffffffffffffe6f0),
             (bool)in_stack_ffffffffffffe6ef);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_ffffffffffffe6df,in_stack_ffffffffffffe6d8),
             (char *)in_stack_ffffffffffffe6d0,(allocator<char> *)in_stack_ffffffffffffe6c8);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_ffffffffffffe6df,in_stack_ffffffffffffe6d8),
             (char *)in_stack_ffffffffffffe6d0,(allocator<char> *)in_stack_ffffffffffffe6c8);
  local_13b8 = 0;
  uStack_13b0 = 0;
  local_13a8 = 0;
  std::vector<RPCResult,_std::allocator<RPCResult>_>::vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)in_stack_ffffffffffffe688);
  RPCResult::RPCResult
            (in_stack_ffffffffffffe710,in_stack_ffffffffffffe70c,
             (string *)CONCAT44(in_stack_ffffffffffffe704,in_stack_ffffffffffffe700),
             in_stack_ffffffffffffe6f8,
             (vector<RPCResult,_std::allocator<RPCResult>_> *)
             CONCAT44(in_stack_ffffffffffffe6f4,in_stack_ffffffffffffe6f0),
             (bool)in_stack_ffffffffffffe6ef);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_ffffffffffffe6df,in_stack_ffffffffffffe6d8),
             (char *)in_stack_ffffffffffffe6d0,(allocator<char> *)in_stack_ffffffffffffe6c8);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_ffffffffffffe6df,in_stack_ffffffffffffe6d8),
             (char *)in_stack_ffffffffffffe6d0,(allocator<char> *)in_stack_ffffffffffffe6c8);
  local_13d8 = 0;
  uStack_13d0 = 0;
  local_13c8 = 0;
  std::vector<RPCResult,_std::allocator<RPCResult>_>::vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)in_stack_ffffffffffffe688);
  RPCResult::RPCResult
            (in_stack_ffffffffffffe710,in_stack_ffffffffffffe70c,
             (string *)CONCAT44(in_stack_ffffffffffffe704,in_stack_ffffffffffffe700),
             in_stack_ffffffffffffe6f8,
             (vector<RPCResult,_std::allocator<RPCResult>_> *)
             CONCAT44(in_stack_ffffffffffffe6f4,in_stack_ffffffffffffe6f0),
             (bool)in_stack_ffffffffffffe6ef);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_ffffffffffffe6df,in_stack_ffffffffffffe6d8),
             (char *)in_stack_ffffffffffffe6d0,(allocator<char> *)in_stack_ffffffffffffe6c8);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_ffffffffffffe6df,in_stack_ffffffffffffe6d8),
             (char *)in_stack_ffffffffffffe6d0,(allocator<char> *)in_stack_ffffffffffffe6c8);
  local_13fa._2_8_ = 0;
  uStack_13f0 = 0;
  local_13e8 = 0;
  std::vector<RPCResult,_std::allocator<RPCResult>_>::vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)in_stack_ffffffffffffe688);
  RPCResult::RPCResult
            (in_stack_ffffffffffffe710,in_stack_ffffffffffffe70c,
             (string *)CONCAT44(in_stack_ffffffffffffe704,in_stack_ffffffffffffe700),
             in_stack_ffffffffffffe6f8,
             (vector<RPCResult,_std::allocator<RPCResult>_> *)
             CONCAT44(in_stack_ffffffffffffe6f4,in_stack_ffffffffffffe6f0),
             (bool)in_stack_ffffffffffffe6ef);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_ffffffffffffe6df,in_stack_ffffffffffffe6d8),
             (char *)in_stack_ffffffffffffe6d0,(allocator<char> *)in_stack_ffffffffffffe6c8);
  fun = (RPCMethodImpl *)local_13fa;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_ffffffffffffe6df,in_stack_ffffffffffffe6d8),
             (char *)in_stack_ffffffffffffe6d0,(allocator<char> *)in_stack_ffffffffffffe6c8);
  local_1418 = 0;
  uStack_1410 = 0;
  local_1408 = 0;
  std::vector<RPCResult,_std::allocator<RPCResult>_>::vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)in_stack_ffffffffffffe688);
  RPCResult::RPCResult
            (in_stack_ffffffffffffe710,in_stack_ffffffffffffe70c,
             (string *)CONCAT44(in_stack_ffffffffffffe704,in_stack_ffffffffffffe700),
             in_stack_ffffffffffffe6f8,
             (vector<RPCResult,_std::allocator<RPCResult>_> *)
             CONCAT44(in_stack_ffffffffffffe6f4,in_stack_ffffffffffffe6f0),
             (bool)in_stack_ffffffffffffe6ef);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_ffffffffffffe6df,in_stack_ffffffffffffe6d8),
             (char *)in_stack_ffffffffffffe6d0,(allocator<char> *)in_stack_ffffffffffffe6c8);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_ffffffffffffe6df,in_stack_ffffffffffffe6d8),
             (char *)in_stack_ffffffffffffe6d0,(allocator<char> *)in_stack_ffffffffffffe6c8);
  local_1438 = 0;
  uStack_1430 = 0;
  local_1428 = 0;
  std::vector<RPCResult,_std::allocator<RPCResult>_>::vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)in_stack_ffffffffffffe688);
  RPCResult::RPCResult
            (in_stack_ffffffffffffe710,in_stack_ffffffffffffe70c,
             (string *)CONCAT44(in_stack_ffffffffffffe704,in_stack_ffffffffffffe700),
             in_stack_ffffffffffffe6f8,
             (vector<RPCResult,_std::allocator<RPCResult>_> *)
             CONCAT44(in_stack_ffffffffffffe6f4,in_stack_ffffffffffffe6f0),
             (bool)in_stack_ffffffffffffe6ef);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_ffffffffffffe6df,in_stack_ffffffffffffe6d8),
             (char *)in_stack_ffffffffffffe6d0,(allocator<char> *)in_stack_ffffffffffffe6c8);
  std::operator+((char *)CONCAT17(in_stack_ffffffffffffe6df,in_stack_ffffffffffffe6d8),
                 in_stack_ffffffffffffe6d0);
  local_1458 = 0;
  uStack_1450 = 0;
  local_1448 = 0;
  std::vector<RPCResult,_std::allocator<RPCResult>_>::vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)in_stack_ffffffffffffe688);
  RPCResult::RPCResult
            (in_stack_ffffffffffffe710,in_stack_ffffffffffffe70c,
             (string *)CONCAT44(in_stack_ffffffffffffe704,in_stack_ffffffffffffe700),
             in_stack_ffffffffffffe6f8,
             (vector<RPCResult,_std::allocator<RPCResult>_> *)
             CONCAT44(in_stack_ffffffffffffe6f4,in_stack_ffffffffffffe6f0),
             (bool)in_stack_ffffffffffffe6ef);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_ffffffffffffe6df,in_stack_ffffffffffffe6d8),
             (char *)in_stack_ffffffffffffe6d0,(allocator<char> *)in_stack_ffffffffffffe6c8);
  std::operator+((char *)CONCAT17(in_stack_ffffffffffffe6df,in_stack_ffffffffffffe6d8),
                 in_stack_ffffffffffffe6d0);
  local_1478 = 0;
  uStack_1470 = 0;
  local_1468 = 0;
  std::vector<RPCResult,_std::allocator<RPCResult>_>::vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)in_stack_ffffffffffffe688);
  RPCResult::RPCResult
            (in_stack_ffffffffffffe710,in_stack_ffffffffffffe70c,
             (string *)CONCAT44(in_stack_ffffffffffffe704,in_stack_ffffffffffffe700),
             in_stack_ffffffffffffe6f8,
             (vector<RPCResult,_std::allocator<RPCResult>_> *)
             CONCAT44(in_stack_ffffffffffffe6f4,in_stack_ffffffffffffe6f0),
             (bool)in_stack_ffffffffffffe6ef);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_ffffffffffffe6df,in_stack_ffffffffffffe6d8),
             (char *)in_stack_ffffffffffffe6d0,(allocator<char> *)in_stack_ffffffffffffe6c8);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_ffffffffffffe6df,in_stack_ffffffffffffe6d8),
             (char *)in_stack_ffffffffffffe6d0,(allocator<char> *)in_stack_ffffffffffffe6c8);
  local_1498 = 0;
  uStack_1490 = 0;
  local_1488 = 0;
  std::vector<RPCResult,_std::allocator<RPCResult>_>::vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)in_stack_ffffffffffffe688);
  RPCResult::RPCResult
            (in_stack_ffffffffffffe710,in_stack_ffffffffffffe70c,
             (string *)CONCAT44(in_stack_ffffffffffffe704,in_stack_ffffffffffffe700),
             in_stack_ffffffffffffe6f8,
             (vector<RPCResult,_std::allocator<RPCResult>_> *)
             CONCAT44(in_stack_ffffffffffffe6f4,in_stack_ffffffffffffe6f0),
             (bool)in_stack_ffffffffffffe6ef);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_ffffffffffffe6df,in_stack_ffffffffffffe6d8),
             (char *)in_stack_ffffffffffffe6d0,(allocator<char> *)in_stack_ffffffffffffe6c8);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_ffffffffffffe6df,in_stack_ffffffffffffe6d8),
             (char *)in_stack_ffffffffffffe6d0,(allocator<char> *)in_stack_ffffffffffffe6c8);
  local_14b8 = (pointer)0x0;
  pbStack_14b0 = (pointer)0x0;
  local_14a8 = (pointer)0x0;
  std::vector<RPCResult,_std::allocator<RPCResult>_>::vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)in_stack_ffffffffffffe688);
  RPCResult::RPCResult
            (in_stack_ffffffffffffe710,in_stack_ffffffffffffe70c,
             (string *)CONCAT44(in_stack_ffffffffffffe704,in_stack_ffffffffffffe700),
             in_stack_ffffffffffffe6f8,
             (vector<RPCResult,_std::allocator<RPCResult>_> *)
             CONCAT44(in_stack_ffffffffffffe6f4,in_stack_ffffffffffffe6f0),
             (bool)in_stack_ffffffffffffe6ef);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_ffffffffffffe6df,in_stack_ffffffffffffe6d8),
             (char *)in_stack_ffffffffffffe6d0,(allocator<char> *)in_stack_ffffffffffffe6c8);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_ffffffffffffe6df,in_stack_ffffffffffffe6d8),
             (char *)in_stack_ffffffffffffe6d0,(allocator<char> *)in_stack_ffffffffffffe6c8);
  local_14d8._M_p = (pointer)0x0;
  sStack_14d0 = 0;
  local_14c8._0_8_ = 0;
  std::vector<RPCResult,_std::allocator<RPCResult>_>::vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)in_stack_ffffffffffffe688);
  RPCResult::RPCResult
            (in_stack_ffffffffffffe710,in_stack_ffffffffffffe70c,
             (string *)CONCAT44(in_stack_ffffffffffffe704,in_stack_ffffffffffffe700),
             in_stack_ffffffffffffe6f8,
             (vector<RPCResult,_std::allocator<RPCResult>_> *)
             CONCAT44(in_stack_ffffffffffffe6f4,in_stack_ffffffffffffe6f0),
             (bool)in_stack_ffffffffffffe6ef);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_ffffffffffffe6df,in_stack_ffffffffffffe6d8),
             (char *)in_stack_ffffffffffffe6d0,(allocator<char> *)in_stack_ffffffffffffe6c8);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_ffffffffffffe6df,in_stack_ffffffffffffe6d8),
             (char *)in_stack_ffffffffffffe6d0,(allocator<char> *)in_stack_ffffffffffffe6c8);
  local_14f8 = 0;
  aStack_14f0._M_allocated_capacity = 0;
  aStack_14f0._8_8_ = 0;
  std::vector<RPCResult,_std::allocator<RPCResult>_>::vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)in_stack_ffffffffffffe688);
  RPCResult::RPCResult
            (in_stack_ffffffffffffe710,in_stack_ffffffffffffe70c,
             (string *)CONCAT44(in_stack_ffffffffffffe704,in_stack_ffffffffffffe700),
             in_stack_ffffffffffffe6f8,
             (vector<RPCResult,_std::allocator<RPCResult>_> *)
             CONCAT44(in_stack_ffffffffffffe6f4,in_stack_ffffffffffffe6f0),
             (bool)in_stack_ffffffffffffe6ef);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_ffffffffffffe6df,in_stack_ffffffffffffe6d8),
             (char *)in_stack_ffffffffffffe6d0,(allocator<char> *)in_stack_ffffffffffffe6c8);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_ffffffffffffe6df,in_stack_ffffffffffffe6d8),
             (char *)in_stack_ffffffffffffe6d0,(allocator<char> *)in_stack_ffffffffffffe6c8);
  local_1519._1_8_ = 0;
  local_1519._9_8_ = 0;
  local_1519._17_8_ = 0;
  this_02 = (RPCHelpMan *)(local_1519 + 1);
  std::vector<RPCResult,_std::allocator<RPCResult>_>::vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)in_stack_ffffffffffffe688);
  RPCResult::RPCResult
            (in_stack_ffffffffffffe710,in_stack_ffffffffffffe70c,
             (string *)CONCAT44(in_stack_ffffffffffffe704,in_stack_ffffffffffffe700),
             in_stack_ffffffffffffe6f8,
             (vector<RPCResult,_std::allocator<RPCResult>_> *)
             CONCAT44(in_stack_ffffffffffffe6f4,in_stack_ffffffffffffe6f0),
             (bool)in_stack_ffffffffffffe6ef);
  description = local_700;
  name = (string *)local_1519;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_ffffffffffffe6df,in_stack_ffffffffffffe6d8),
             (char *)in_stack_ffffffffffffe6d0,(allocator<char> *)in_stack_ffffffffffffe6c8);
  args = (vector<RPCArg,_std::allocator<RPCArg>_> *)&local_151a;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_ffffffffffffe6df,in_stack_ffffffffffffe6d8),
             (char *)in_stack_ffffffffffffe6d0,(allocator<char> *)in_stack_ffffffffffffe6c8);
  local_1539._1_8_ = 0;
  local_1539._9_8_ = 0;
  local_1539._17_8_ = 0;
  results_00 = (RPCResults *)(local_1539 + 1);
  std::vector<RPCResult,_std::allocator<RPCResult>_>::vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)in_stack_ffffffffffffe688);
  this = (vector<RPCResult,_std::allocator<RPCResult>_> *)
         ((ulong)in_stack_ffffffffffffe688 & 0xffffffff00000000);
  RPCResult::RPCResult
            ((RPCResult *)CONCAT44(in_stack_ffffffffffffe70c,in_stack_ffffffffffffe708),
             in_stack_ffffffffffffe704,in_stack_ffffffffffffe6f8,
             SUB41(in_stack_ffffffffffffe6f4 >> 0x18,0),
             (string *)CONCAT17(in_stack_ffffffffffffe6ef,in_stack_ffffffffffffe6e8),
             (vector<RPCResult,_std::allocator<RPCResult>_> *)in_stack_ffffffffffffe6e0,
             (bool)in_stack_ffffffffffffe6df);
  examples = (RPCExamples *)local_1539;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_ffffffffffffe6df,in_stack_ffffffffffffe6d8),
             (char *)in_stack_ffffffffffffe6d0,(allocator<char> *)in_stack_ffffffffffffe6c8);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_ffffffffffffe6df,in_stack_ffffffffffffe6d8),
             (char *)in_stack_ffffffffffffe6d0,(allocator<char> *)in_stack_ffffffffffffe6c8);
  local_155a[2] = (allocator<char>)0x0;
  local_155a[3] = (allocator<char>)0x0;
  local_155a[4] = (allocator<char>)0x0;
  local_155a[5] = (allocator<char>)0x0;
  local_155a[6] = (allocator<char>)0x0;
  local_155a[7] = (allocator<char>)0x0;
  local_155a[8] = (allocator<char>)0x0;
  local_155a[9] = (allocator<char>)0x0;
  local_155a[10] = (allocator<char>)0x0;
  local_155a[0xb] = (allocator<char>)0x0;
  local_155a[0xc] = (allocator<char>)0x0;
  local_155a[0xd] = (allocator<char>)0x0;
  local_155a[0xe] = (allocator<char>)0x0;
  local_155a[0xf] = (allocator<char>)0x0;
  local_155a[0x10] = (allocator<char>)0x0;
  local_155a[0x11] = (allocator<char>)0x0;
  local_155a[0x12] = (allocator<char>)0x0;
  local_155a[0x13] = (allocator<char>)0x0;
  local_155a[0x14] = (allocator<char>)0x0;
  local_155a[0x15] = (allocator<char>)0x0;
  local_155a[0x16] = (allocator<char>)0x0;
  local_155a[0x17] = (allocator<char>)0x0;
  local_155a[0x18] = (allocator<char>)0x0;
  local_155a[0x19] = (allocator<char>)0x0;
  std::vector<RPCResult,_std::allocator<RPCResult>_>::vector(this);
  this_00 = (allocator<RPCResult> *)((ulong)this & 0xffffffff00000000);
  RPCResult::RPCResult
            ((RPCResult *)CONCAT44(in_stack_ffffffffffffe70c,in_stack_ffffffffffffe708),
             in_stack_ffffffffffffe704,in_stack_ffffffffffffe6f8,
             SUB41(in_stack_ffffffffffffe6f4 >> 0x18,0),
             (string *)CONCAT17(in_stack_ffffffffffffe6ef,in_stack_ffffffffffffe6e8),
             (vector<RPCResult,_std::allocator<RPCResult>_> *)in_stack_ffffffffffffe6e0,
             (bool)in_stack_ffffffffffffe6df);
  std::allocator<RPCResult>::allocator(this_00);
  __l_00._M_len._0_7_ = in_stack_ffffffffffffe6d8;
  __l_00._M_array = (iterator)in_stack_ffffffffffffe6d0;
  __l_00._M_len._7_1_ = in_stack_ffffffffffffe6df;
  std::vector<RPCResult,_std::allocator<RPCResult>_>::vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)in_stack_ffffffffffffe6c8,__l_00,
             (allocator_type *)in_stack_ffffffffffffe6c0);
  RPCResult::RPCResult
            (in_stack_ffffffffffffe710,
             (string *)CONCAT44(in_stack_ffffffffffffe70c,in_stack_ffffffffffffe708),
             in_stack_ffffffffffffe704,in_stack_ffffffffffffe6f8,
             (string *)CONCAT44(in_stack_ffffffffffffe6f4,in_stack_ffffffffffffe6f0),
             (vector<RPCResult,_std::allocator<RPCResult>_> *)
             CONCAT17(in_stack_ffffffffffffe6ef,in_stack_ffffffffffffe6e8));
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_ffffffffffffe6df,in_stack_ffffffffffffe6d8),
             (char *)in_stack_ffffffffffffe6d0,(allocator<char> *)in_stack_ffffffffffffe6c8);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_ffffffffffffe6df,in_stack_ffffffffffffe6d8),
             (char *)in_stack_ffffffffffffe6d0,(allocator<char> *)in_stack_ffffffffffffe6c8);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_ffffffffffffe6df,in_stack_ffffffffffffe6d8),
             (char *)in_stack_ffffffffffffe6d0,(allocator<char> *)in_stack_ffffffffffffe6c8);
  local_1578 = (pointer)0x0;
  pRStack_1570 = (pointer)0x0;
  local_1568 = (pointer)0x0;
  std::vector<RPCResult,_std::allocator<RPCResult>_>::vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)this_00);
  RPCResult::RPCResult
            (in_stack_ffffffffffffe710,
             (string *)CONCAT44(in_stack_ffffffffffffe70c,in_stack_ffffffffffffe708),
             in_stack_ffffffffffffe704,in_stack_ffffffffffffe6f8,
             (string *)CONCAT44(in_stack_ffffffffffffe6f4,in_stack_ffffffffffffe6f0),
             (vector<RPCResult,_std::allocator<RPCResult>_> *)
             CONCAT17(in_stack_ffffffffffffe6ef,in_stack_ffffffffffffe6e8));
  results._M_len._0_7_ = in_stack_ffffffffffffe6d8;
  results._M_array = (iterator)in_stack_ffffffffffffe6d0;
  results._M_len._7_1_ = in_stack_ffffffffffffe6df;
  RPCResults::RPCResults(in_stack_ffffffffffffe6b0,results);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_ffffffffffffe6df,in_stack_ffffffffffffe6d8),
             (char *)in_stack_ffffffffffffe6d0,(allocator<char> *)in_stack_ffffffffffffe6c8);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_ffffffffffffe6df,in_stack_ffffffffffffe6d8),
             (char *)in_stack_ffffffffffffe6d0,(allocator<char> *)in_stack_ffffffffffffe6c8);
  HelpExampleCli(in_stack_ffffffffffffe6c0,in_stack_ffffffffffffe6b8);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_ffffffffffffe6df,in_stack_ffffffffffffe6d8),
             (char *)in_stack_ffffffffffffe6d0,(allocator<char> *)in_stack_ffffffffffffe6c8);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_ffffffffffffe6df,in_stack_ffffffffffffe6d8),
             (char *)in_stack_ffffffffffffe6d0,(allocator<char> *)in_stack_ffffffffffffe6c8);
  HelpExampleRpc(in_stack_ffffffffffffe6c0,in_stack_ffffffffffffe6b8);
  std::operator+(in_stack_ffffffffffffe6c0,in_stack_ffffffffffffe6b8);
  RPCExamples::RPCExamples((RPCExamples *)this_00,(string *)0x128522b);
  this_01 = (RPCArg *)local_15a0;
  std::function<UniValue(RPCHelpMan_const&,JSONRPCRequest_const&)>::
  function<getblockheader()::__0,void>
            (in_stack_ffffffffffffe698,(anon_class_1_0_00000001 *)in_stack_ffffffffffffe690);
  RPCHelpMan::RPCHelpMan(this_02,name,description,args,results_00,examples,fun);
  std::function<UniValue_(const_RPCHelpMan_&,_const_JSONRPCRequest_&)>::~function
            ((function<UniValue_(const_RPCHelpMan_&,_const_JSONRPCRequest_&)> *)this_01);
  RPCExamples::~RPCExamples((RPCExamples *)this_01);
  std::__cxx11::string::~string(&this_01->m_names);
  std::__cxx11::string::~string(&this_01->m_names);
  std::__cxx11::string::~string(&this_01->m_names);
  std::allocator<char>::~allocator((allocator<char> *)(local_15a0 + 0x24));
  std::__cxx11::string::~string(&this_01->m_names);
  std::allocator<char>::~allocator(&local_157b);
  std::__cxx11::string::~string(&this_01->m_names);
  std::__cxx11::string::~string(&this_01->m_names);
  std::allocator<char>::~allocator(&local_157a);
  std::__cxx11::string::~string(&this_01->m_names);
  std::allocator<char>::~allocator(&local_1579);
  RPCResults::~RPCResults((RPCResults *)this_01);
  local_18a8 = local_480;
  do {
    local_18a8 = local_18a8 + -0x88;
    RPCResult::~RPCResult((RPCResult *)this_01);
  } while (local_18a8 != local_590);
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)in_stack_ffffffffffffe698);
  std::__cxx11::string::~string(&this_01->m_names);
  std::allocator<char>::~allocator(&local_155c);
  std::__cxx11::string::~string(&this_01->m_names);
  std::allocator<char>::~allocator(&local_155b);
  std::__cxx11::string::~string(&this_01->m_names);
  std::allocator<char>::~allocator(local_155a);
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)in_stack_ffffffffffffe698);
  std::allocator<RPCResult>::~allocator((allocator<RPCResult> *)this_01);
  local_18c0 = local_5f0;
  do {
    local_18c0 = local_18c0 + -0x88;
    RPCResult::~RPCResult((RPCResult *)this_01);
  } while (local_18c0 != local_de8);
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)in_stack_ffffffffffffe698);
  std::__cxx11::string::~string(&this_01->m_names);
  std::allocator<char>::~allocator(&local_153a);
  std::__cxx11::string::~string(&this_01->m_names);
  std::allocator<char>::~allocator((allocator<char> *)local_1539);
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)in_stack_ffffffffffffe698);
  std::__cxx11::string::~string(&this_01->m_names);
  std::allocator<char>::~allocator((allocator<char> *)&local_151a);
  std::__cxx11::string::~string(&this_01->m_names);
  std::allocator<char>::~allocator((allocator<char> *)local_1519);
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)in_stack_ffffffffffffe698);
  std::__cxx11::string::~string(&this_01->m_names);
  std::allocator<char>::~allocator(&local_14fa);
  std::__cxx11::string::~string(&this_01->m_names);
  std::allocator<char>::~allocator(&local_14f9);
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)in_stack_ffffffffffffe698);
  std::__cxx11::string::~string(&this_01->m_names);
  std::allocator<char>::~allocator(&local_14da);
  std::__cxx11::string::~string(&this_01->m_names);
  std::allocator<char>::~allocator(&local_14d9);
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)in_stack_ffffffffffffe698);
  std::__cxx11::string::~string(&this_01->m_names);
  std::allocator<char>::~allocator((allocator<char> *)(local_14c8 + 0xe));
  std::__cxx11::string::~string(&this_01->m_names);
  std::allocator<char>::~allocator(&local_14b9);
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)in_stack_ffffffffffffe698);
  std::__cxx11::string::~string(&this_01->m_names);
  std::allocator<char>::~allocator(&local_149a);
  std::__cxx11::string::~string(&this_01->m_names);
  std::allocator<char>::~allocator(&local_1499);
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)in_stack_ffffffffffffe698);
  std::__cxx11::string::~string(&this_01->m_names);
  std::allocator<char>::~allocator(&local_147a);
  std::__cxx11::string::~string(&this_01->m_names);
  std::allocator<char>::~allocator(&local_1479);
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)in_stack_ffffffffffffe698);
  std::__cxx11::string::~string(&this_01->m_names);
  std::__cxx11::string::~string(&this_01->m_names);
  std::allocator<char>::~allocator(&local_1459);
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)in_stack_ffffffffffffe698);
  std::__cxx11::string::~string(&this_01->m_names);
  std::__cxx11::string::~string(&this_01->m_names);
  std::allocator<char>::~allocator(&local_1439);
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)in_stack_ffffffffffffe698);
  std::__cxx11::string::~string(&this_01->m_names);
  std::allocator<char>::~allocator(&local_141a);
  std::__cxx11::string::~string(&this_01->m_names);
  std::allocator<char>::~allocator(&local_1419);
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)in_stack_ffffffffffffe698);
  std::__cxx11::string::~string(&this_01->m_names);
  std::allocator<char>::~allocator((allocator<char> *)local_13fa);
  std::__cxx11::string::~string(&this_01->m_names);
  std::allocator<char>::~allocator((allocator<char> *)(local_13fa + 1));
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)in_stack_ffffffffffffe698);
  std::__cxx11::string::~string(&this_01->m_names);
  std::allocator<char>::~allocator(&local_13da);
  std::__cxx11::string::~string(&this_01->m_names);
  std::allocator<char>::~allocator(&local_13d9);
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)in_stack_ffffffffffffe698);
  std::__cxx11::string::~string(&this_01->m_names);
  std::allocator<char>::~allocator(&local_13ba);
  std::__cxx11::string::~string(&this_01->m_names);
  std::allocator<char>::~allocator(&local_13b9);
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)in_stack_ffffffffffffe698);
  std::__cxx11::string::~string(&this_01->m_names);
  std::allocator<char>::~allocator(&local_139a);
  std::__cxx11::string::~string(&this_01->m_names);
  std::allocator<char>::~allocator(&local_1399);
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)in_stack_ffffffffffffe698);
  std::__cxx11::string::~string(&this_01->m_names);
  std::allocator<char>::~allocator(&local_1372);
  std::__cxx11::string::~string(&this_01->m_names);
  std::allocator<char>::~allocator(local_1371);
  std::__cxx11::string::~string(&this_01->m_names);
  std::allocator<char>::~allocator(&local_1353);
  std::__cxx11::string::~string(&this_01->m_names);
  std::allocator<char>::~allocator(&local_1352);
  std::__cxx11::string::~string(&this_01->m_names);
  std::allocator<char>::~allocator(local_1351);
  std::vector<RPCArg,_std::allocator<RPCArg>_>::~vector
            ((vector<RPCArg,_std::allocator<RPCArg>_> *)in_stack_ffffffffffffe698);
  std::allocator<RPCArg>::~allocator((allocator<RPCArg> *)this_01);
  local_18d8 = local_48;
  do {
    local_18d8 = local_18d8 + -0x108;
    RPCArg::~RPCArg(this_01);
  } while (local_18d8 != local_258);
  RPCArgOptions::~RPCArgOptions((RPCArgOptions *)this_01);
  std::__cxx11::string::~string(&this_01->m_names);
  std::allocator<char>::~allocator(&local_1334);
  std::
  variant<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  ::~variant((variant<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
              *)this_01);
  UniValue::~UniValue((UniValue *)this_01);
  std::__cxx11::string::~string(&this_01->m_names);
  std::allocator<char>::~allocator(&local_1332);
  RPCArgOptions::~RPCArgOptions((RPCArgOptions *)this_01);
  std::__cxx11::string::~string(&this_01->m_names);
  std::allocator<char>::~allocator(&local_1331);
  std::
  variant<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  ::~variant((variant<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
              *)this_01);
  std::__cxx11::string::~string(&this_01->m_names);
  std::allocator<char>::~allocator(local_1329);
  std::__cxx11::string::~string(&this_01->m_names);
  std::allocator<char>::~allocator(&local_130a);
  std::__cxx11::string::~string(&this_01->m_names);
  std::allocator<char>::~allocator(local_1309);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return in_RDI;
  }
  __stack_chk_fail();
}

Assistant:

static RPCHelpMan getblockheader()
{
    return RPCHelpMan{"getblockheader",
                "\nIf verbose is false, returns a string that is serialized, hex-encoded data for blockheader 'hash'.\n"
                "If verbose is true, returns an Object with information about blockheader <hash>.\n",
                {
                    {"blockhash", RPCArg::Type::STR_HEX, RPCArg::Optional::NO, "The block hash"},
                    {"verbose", RPCArg::Type::BOOL, RPCArg::Default{true}, "true for a json object, false for the hex-encoded data"},
                },
                {
                    RPCResult{"for verbose = true",
                        RPCResult::Type::OBJ, "", "",
                        {
                            {RPCResult::Type::STR_HEX, "hash", "the block hash (same as provided)"},
                            {RPCResult::Type::NUM, "confirmations", "The number of confirmations, or -1 if the block is not on the main chain"},
                            {RPCResult::Type::NUM, "height", "The block height or index"},
                            {RPCResult::Type::NUM, "version", "The block version"},
                            {RPCResult::Type::STR_HEX, "versionHex", "The block version formatted in hexadecimal"},
                            {RPCResult::Type::STR_HEX, "merkleroot", "The merkle root"},
                            {RPCResult::Type::NUM_TIME, "time", "The block time expressed in " + UNIX_EPOCH_TIME},
                            {RPCResult::Type::NUM_TIME, "mediantime", "The median block time expressed in " + UNIX_EPOCH_TIME},
                            {RPCResult::Type::NUM, "nonce", "The nonce"},
                            {RPCResult::Type::STR_HEX, "bits", "The bits"},
                            {RPCResult::Type::NUM, "difficulty", "The difficulty"},
                            {RPCResult::Type::STR_HEX, "chainwork", "Expected number of hashes required to produce the current chain"},
                            {RPCResult::Type::NUM, "nTx", "The number of transactions in the block"},
                            {RPCResult::Type::STR_HEX, "previousblockhash", /*optional=*/true, "The hash of the previous block (if available)"},
                            {RPCResult::Type::STR_HEX, "nextblockhash", /*optional=*/true, "The hash of the next block (if available)"},
                        }},
                    RPCResult{"for verbose=false",
                        RPCResult::Type::STR_HEX, "", "A string that is serialized, hex-encoded data for block 'hash'"},
                },
                RPCExamples{
                    HelpExampleCli("getblockheader", "\"00000000c937983704a73af28acdec37b049d214adbda81d7e2a3dd146f6ed09\"")
            + HelpExampleRpc("getblockheader", "\"00000000c937983704a73af28acdec37b049d214adbda81d7e2a3dd146f6ed09\"")
                },
        [&](const RPCHelpMan& self, const JSONRPCRequest& request) -> UniValue
{
    uint256 hash(ParseHashV(request.params[0], "hash"));

    bool fVerbose = true;
    if (!request.params[1].isNull())
        fVerbose = request.params[1].get_bool();

    const CBlockIndex* pblockindex;
    const CBlockIndex* tip;
    {
        ChainstateManager& chainman = EnsureAnyChainman(request.context);
        LOCK(cs_main);
        pblockindex = chainman.m_blockman.LookupBlockIndex(hash);
        tip = chainman.ActiveChain().Tip();
    }

    if (!pblockindex) {
        throw JSONRPCError(RPC_INVALID_ADDRESS_OR_KEY, "Block not found");
    }

    if (!fVerbose)
    {
        DataStream ssBlock{};
        ssBlock << pblockindex->GetBlockHeader();
        std::string strHex = HexStr(ssBlock);
        return strHex;
    }

    return blockheaderToJSON(*tip, *pblockindex);
},
    };
}